

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.cpp
# Opt level: O0

bool __thiscall SudokuGenerator::generateCell(SudokuGenerator *this,uint row,uint column)

{
  allocator<cell> *paVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  result_type_conflict rVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  reference pvVar10;
  reference pvVar11;
  cell cVar12;
  reference pcVar13;
  ulong uVar14;
  size_type sVar15;
  reference pvVar16;
  ostream *poVar17;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar18;
  cell local_51b8;
  undefined4 local_51b0;
  allocator local_51a9;
  string local_51a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5188;
  allocator local_5169;
  string local_5168;
  vector<cell,_std::allocator<cell>_> local_5148;
  allocator local_5129;
  string local_5128;
  vector<cell,_std::allocator<cell>_> local_5108;
  allocator local_50e9;
  string local_50e8;
  vector<cell,_std::allocator<cell>_> local_50c8;
  value_type local_50b0;
  uint local_50ac;
  uint tmp;
  uint i_2;
  uint nextCol;
  uint nextRow;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_3d18;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2990;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2988;
  insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_2980;
  uint *local_2970;
  insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_2968;
  _Rb_tree_const_iterator<int> local_2958;
  _Rb_tree_const_iterator<int> local_2950;
  _Rb_tree_const_iterator<int> local_2948;
  _Rb_tree_const_iterator<int> local_2940;
  undefined1 local_2938 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> options;
  uint local_2910;
  uint local_290c;
  undefined1 local_2908 [4];
  uint i_1;
  set<int,_std::less<int>,_std::allocator<int>_> values;
  uint local_28c4;
  cell local_28c0;
  cell val_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cell,_std::allocator<cell>_> *__range1_2;
  uint local_288c;
  cell local_2888;
  cell val_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cell,_std::allocator<cell>_> *__range1_1;
  uint local_2854;
  cell local_2850;
  cell val;
  iterator __end1;
  iterator __begin1;
  vector<cell,_std::allocator<cell>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> neighbours;
  uint local_27f4;
  uint local_27f0;
  uint tmpCol;
  uint tmpRow_1;
  int indexQuad;
  uint quadStartCol;
  uint quadStartRow;
  uint local_27d8;
  allocator<cell> local_27d1;
  uint tmpRow;
  vector<cell,_std::allocator<cell>_> currCol;
  undefined1 local_27b0 [8];
  vector<cell,_std::allocator<cell>_> currRow;
  undefined1 local_2790 [8];
  vector<cell,_std::allocator<cell>_> quad;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13f0;
  __normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_> local_68;
  __normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_> local_60;
  cell local_58;
  uint local_50;
  uint i;
  allocator<cell> local_39;
  undefined1 local_38 [8];
  vector<cell,_std::allocator<cell>_> ziffern;
  uint column_local;
  uint row_local;
  SudokuGenerator *this_local;
  
  ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = column;
  ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = row;
  uVar3 = SudokuGitter::getElements(&this->gitter);
  std::allocator<cell>::allocator(&local_39);
  std::vector<cell,_std::allocator<cell>_>::vector
            ((vector<cell,_std::allocator<cell>_> *)local_38,(ulong)uVar3,&local_39);
  std::allocator<cell>::~allocator(&local_39);
  for (local_50 = 0; uVar3 = local_50, uVar4 = SudokuGitter::getElements(&this->gitter),
      uVar3 < uVar4; local_50 = local_50 + 1) {
    cell::cell(&local_58,local_50 + 1);
    pvVar10 = std::vector<cell,_std::allocator<cell>_>::operator[]
                        ((vector<cell,_std::allocator<cell>_> *)local_38,(ulong)local_50);
    pvVar10->value = local_58.value;
    pvVar10->isStatic = local_58.isStatic;
  }
  local_60._M_current =
       (cell *)std::begin<std::vector<cell,std::allocator<cell>>>
                         ((vector<cell,_std::allocator<cell>_> *)local_38);
  local_68._M_current =
       (cell *)std::end<std::vector<cell,std::allocator<cell>>>
                         ((vector<cell,_std::allocator<cell>_> *)local_38);
  std::random_device::random_device
            ((random_device *)
             &quad.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  rVar5 = std::random_device::operator()
                    ((random_device *)
                     &quad.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13f0,(ulong)rVar5);
  std::
  shuffle<__gnu_cxx::__normal_iterator<cell*,std::vector<cell,std::allocator<cell>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_60,local_68,&local_13f0);
  std::random_device::~random_device
            ((random_device *)
             &quad.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  uVar3 = SudokuGitter::getElements(&this->gitter);
  paVar1 = (allocator<cell> *)
           ((long)&currRow.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cell>::allocator(paVar1);
  std::vector<cell,_std::allocator<cell>_>::vector
            ((vector<cell,_std::allocator<cell>_> *)local_2790,(ulong)uVar3,paVar1);
  std::allocator<cell>::~allocator
            ((allocator<cell> *)
             ((long)&currRow.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  uVar3 = SudokuGitter::getElements(&this->gitter);
  paVar1 = (allocator<cell> *)
           ((long)&currCol.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cell>::allocator(paVar1);
  std::vector<cell,_std::allocator<cell>_>::vector
            ((vector<cell,_std::allocator<cell>_> *)local_27b0,(ulong)uVar3,paVar1);
  std::allocator<cell>::~allocator
            ((allocator<cell> *)
             ((long)&currCol.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  uVar3 = SudokuGitter::getElements(&this->gitter);
  std::allocator<cell>::allocator(&local_27d1);
  std::vector<cell,_std::allocator<cell>_>::vector
            ((vector<cell,_std::allocator<cell>_> *)&tmpRow,(ulong)uVar3,&local_27d1);
  std::allocator<cell>::~allocator(&local_27d1);
  pvVar11 = std::
            vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
            ::operator[](&(this->gitter).cells,
                         (ulong)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<cell,_std::allocator<cell>_>::operator=
            ((vector<cell,_std::allocator<cell>_> *)local_27b0,pvVar11);
  for (local_27d8 = 0; uVar4 = SudokuGitter::getElements(&this->gitter),
      uVar3 = ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_, local_27d8 < uVar4;
      local_27d8 = local_27d8 + 1) {
    cVar12 = SudokuGitter::getCell
                       (&this->gitter,local_27d8,
                        (uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
    pvVar10 = std::vector<cell,_std::allocator<cell>_>::operator[]
                        ((vector<cell,_std::allocator<cell>_> *)&tmpRow,(ulong)local_27d8);
    pvVar10->value = cVar12.value;
    pvVar10->isStatic = cVar12.isStatic;
  }
  uVar6 = SudokuGitter::getQuadHeight(&this->gitter);
  uVar7 = SudokuGitter::getQuadHeight(&this->gitter);
  uVar4 = (uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  uVar8 = SudokuGitter::getQuadWidth(&this->gitter);
  uVar9 = SudokuGitter::getQuadWidth(&this->gitter);
  uVar9 = (uVar4 / uVar8) * uVar9;
  tmpCol = 0;
  uVar7 = (uVar3 / uVar6) * uVar7;
  for (local_27f0 = uVar7; uVar3 = SudokuGitter::getQuadHeight(&this->gitter), local_27f4 = uVar9,
      local_27f0 < uVar7 + uVar3; local_27f0 = local_27f0 + 1) {
    for (; uVar3 = SudokuGitter::getQuadWidth(&this->gitter), local_27f4 < uVar9 + uVar3;
        local_27f4 = local_27f4 + 1) {
      cVar12 = SudokuGitter::getCell(&this->gitter,local_27f0,local_27f4);
      neighbours._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = cVar12.value;
      pvVar10 = std::vector<cell,_std::allocator<cell>_>::operator[]
                          ((vector<cell,_std::allocator<cell>_> *)local_2790,(long)(int)tmpCol);
      pvVar10->value = neighbours._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      pvVar10->isStatic = cVar12.isStatic;
      tmpCol = tmpCol + 1;
    }
  }
  memset(&__range1,0,0x30);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  __end1 = std::vector<cell,_std::allocator<cell>_>::begin
                     ((vector<cell,_std::allocator<cell>_> *)local_27b0);
  val = (cell)std::vector<cell,_std::allocator<cell>_>::end
                        ((vector<cell,_std::allocator<cell>_> *)local_27b0);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>
                                     *)&val), bVar2) {
    pcVar13 = __gnu_cxx::__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>::
              operator*(&__end1);
    local_2850 = *pcVar13;
    local_2854 = local_2850.value;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
               (value_type_conflict1 *)&local_2854);
    __gnu_cxx::__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<cell,_std::allocator<cell>_>::begin
                       ((vector<cell,_std::allocator<cell>_> *)&tmpRow);
  val_1 = (cell)std::vector<cell,_std::allocator<cell>_>::end
                          ((vector<cell,_std::allocator<cell>_> *)&tmpRow);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_> *)
                            &val_1), bVar2) {
    pcVar13 = __gnu_cxx::__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>::
              operator*(&__end1_1);
    local_2888 = *pcVar13;
    local_288c = local_2888.value;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
               (value_type_conflict1 *)&local_288c);
    __gnu_cxx::__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>::operator++
              (&__end1_1);
  }
  __end1_2 = std::vector<cell,_std::allocator<cell>_>::begin
                       ((vector<cell,_std::allocator<cell>_> *)local_2790);
  val_2 = (cell)std::vector<cell,_std::allocator<cell>_>::end
                          ((vector<cell,_std::allocator<cell>_> *)local_2790);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_> *)
                            &val_2), bVar2) {
    pcVar13 = __gnu_cxx::__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>::
              operator*(&__end1_2);
    local_28c0 = *pcVar13;
    local_28c4 = local_28c0.value;
    pVar18 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
                        (value_type_conflict1 *)&local_28c4);
    values._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar18.first._M_node;
    __gnu_cxx::__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>::operator++
              (&__end1_2);
  }
  memset(local_2908,0,0x30);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2908);
  for (local_290c = 1; uVar3 = local_290c, uVar4 = SudokuGitter::getElements(&this->gitter),
      uVar3 <= uVar4; local_290c = local_290c + 1) {
    local_2910 = local_290c;
    pVar18 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2908,
                        (value_type_conflict1 *)&local_2910);
    options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pVar18.first._M_node;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938);
  local_2940._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2908);
  local_2948._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2908);
  local_2950._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  local_2958._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  local_2970 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938)
  ;
  local_2968 = std::inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938,
                          (iterator)local_2970);
  local_2980 = std::
               set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                         (local_2940,local_2948,local_2950,local_2958,local_2968);
  local_2988._M_current =
       (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938);
  local_2990._M_current =
       (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938);
  std::random_device::random_device((random_device *)&nextCol);
  rVar5 = std::random_device::operator()((random_device *)&nextCol);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_3d18,(ulong)rVar5);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_2988,local_2990,&local_3d18);
  std::random_device::~random_device((random_device *)&nextCol);
  uVar3 = (uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  i_2 = ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
  tmp = (uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1;
  uVar4 = SudokuGitter::getElements(&this->gitter);
  if (uVar3 == uVar4) {
    tmp = 0;
    i_2 = i_2 + 1;
  }
  local_50ac = 0;
  while( true ) {
    uVar14 = (ulong)local_50ac;
    sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938);
    if (sVar15 <= uVar14) break;
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938,
                         (ulong)local_50ac);
    local_50b0 = *pvVar16;
    poVar17 = std::operator<<((ostream *)&std::cout,"###");
    poVar17 = (ostream *)
              std::ostream::operator<<
                        (poVar17,ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1);
    poVar17 = std::operator<<(poVar17,",");
    poVar17 = (ostream *)
              std::ostream::operator<<
                        (poVar17,(uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    poVar17 = std::operator<<(poVar17,": Versuch ");
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,local_50b0);
    poVar17 = std::operator<<(poVar17,anon_var_dwarf_20233);
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    std::vector<cell,_std::allocator<cell>_>::vector
              (&local_50c8,(vector<cell,_std::allocator<cell>_> *)local_27b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50e8,"Row",&local_50e9);
    SudokuGitter::printCellVec(&local_50c8,&local_50e8);
    std::__cxx11::string::~string((string *)&local_50e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_50e9);
    std::vector<cell,_std::allocator<cell>_>::~vector(&local_50c8);
    std::vector<cell,_std::allocator<cell>_>::vector
              (&local_5108,(vector<cell,_std::allocator<cell>_> *)&tmpRow);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5128,"Column",&local_5129);
    SudokuGitter::printCellVec(&local_5108,&local_5128);
    std::__cxx11::string::~string((string *)&local_5128);
    std::allocator<char>::~allocator((allocator<char> *)&local_5129);
    std::vector<cell,_std::allocator<cell>_>::~vector(&local_5108);
    std::vector<cell,_std::allocator<cell>_>::vector
              (&local_5148,(vector<cell,_std::allocator<cell>_> *)local_2790);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5168,"Quad",&local_5169);
    SudokuGitter::printCellVec(&local_5148,&local_5168);
    std::__cxx11::string::~string((string *)&local_5168);
    std::allocator<char>::~allocator((allocator<char> *)&local_5169);
    std::vector<cell,_std::allocator<cell>_>::~vector(&local_5148);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_5188,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_51a8,"Options",&local_51a9);
    SudokuGitter::printIntVec(&local_5188,&local_51a8);
    std::__cxx11::string::~string((string *)&local_51a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_51a9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5188);
    SudokuGitter::setCell
              (&this->gitter,
               ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,
               (uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,local_50b0);
    uVar3 = (uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    uVar4 = SudokuGitter::getElements(&this->gitter);
    if (uVar3 == uVar4 - 1) {
LAB_0011cac3:
      this_local._7_1_ = true;
      goto LAB_0011ccad;
    }
    bVar2 = generateCell(this,i_2,tmp);
    if (bVar2) goto LAB_0011cac3;
    local_50ac = local_50ac + 1;
  }
  pvVar11 = std::
            vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
            ::operator[](&(this->gitter).cells,
                         (ulong)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
  pvVar10 = std::vector<cell,_std::allocator<cell>_>::operator[]
                      (pvVar11,(ulong)(uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((pvVar10->isStatic & 1U) != 0) {
    bVar2 = generateCell(this,i_2,tmp);
    if (bVar2) {
      this_local._7_1_ = true;
      goto LAB_0011ccad;
    }
  }
  cell::cell(&local_51b8,0);
  pvVar11 = std::
            vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
            ::operator[](&(this->gitter).cells,
                         (ulong)ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
  pvVar10 = std::vector<cell,_std::allocator<cell>_>::operator[]
                      (pvVar11,(ulong)(uint)ziffern.super__Vector_base<cell,_std::allocator<cell>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar10->value = local_51b8.value;
  pvVar10->isStatic = local_51b8.isStatic;
  this_local._7_1_ = false;
LAB_0011ccad:
  local_51b0 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2938);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2908);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  std::vector<cell,_std::allocator<cell>_>::~vector((vector<cell,_std::allocator<cell>_> *)&tmpRow);
  std::vector<cell,_std::allocator<cell>_>::~vector
            ((vector<cell,_std::allocator<cell>_> *)local_27b0);
  std::vector<cell,_std::allocator<cell>_>::~vector
            ((vector<cell,_std::allocator<cell>_> *)local_2790);
  std::vector<cell,_std::allocator<cell>_>::~vector((vector<cell,_std::allocator<cell>_> *)local_38)
  ;
  return this_local._7_1_;
}

Assistant:

bool SudokuGenerator::generateCell(unsigned int row, unsigned int column) {
    vector<cell> ziffern(gitter.getElements());
    for (unsigned int i = 0; i < gitter.getElements(); i++)
        ziffern[i] = cell(i + 1);
    shuffle(begin(ziffern), end(ziffern), std::mt19937(std::random_device()()));

    vector<cell> quad(gitter.getElements());
    vector<cell> currRow(gitter.getElements());
    vector<cell> currCol(gitter.getElements());

    // Row Werte merken
    currRow = gitter.cells[row];
    // Column Werte merken
    for (unsigned int tmpRow = 0; tmpRow < gitter.getElements(); tmpRow++) {
        currCol[tmpRow] = gitter.getCell(tmpRow, column);
    }

    // Quad Werte merken
    auto quadStartRow = (row / gitter.getQuadHeight()) * gitter.getQuadHeight();
    auto quadStartCol = (column / gitter.getQuadWidth()) * gitter.getQuadWidth();

    int indexQuad = 0;
    for (auto tmpRow = quadStartRow; tmpRow < quadStartRow + gitter.getQuadHeight(); tmpRow++) {
        for (auto tmpCol = quadStartCol; tmpCol < quadStartCol + gitter.getQuadWidth(); tmpCol++) {
            quad[indexQuad] = gitter.getCell(tmpRow, tmpCol);
            indexQuad++;
        }
    }

    set<int> neighbours = {};

    for (auto val : currRow) {
        neighbours.insert(val.value);
    }
    for (auto val : currCol) {
        neighbours.insert(val.value);
    }
    for (auto val : quad) {
        neighbours.insert(val.value);
    }

    set<int> values = {};

    for (unsigned int i = 1; i <= gitter.getElements(); i++)
        values.insert(i);

    vector<unsigned int> options;
    set_difference(values.begin(), values.end(), neighbours.begin(), neighbours.end(),
                   inserter(options, options.begin()));

    shuffle(begin(options), end(options), std::mt19937(std::random_device()()));

    unsigned int nextRow = row;
    unsigned int nextCol = column + 1;
    if (column == gitter.getElements()) {
        nextCol = 0;
        nextRow++;
    }

    for (unsigned int i = 0; i < options.size(); i++) {
        auto tmp = static_cast<unsigned int>(options[i]);

        std::cout << "###" << row + 1 << "," << column + 1 << ": Versuch " << tmp << " einzufügen. Umgebung: "
                  << std::endl;
        SudokuGitter::printCellVec(currRow, "Row");
        SudokuGitter::printCellVec(currCol, "Column");
        SudokuGitter::printCellVec(quad, "Quad");
        SudokuGitter::printIntVec(options, "Options");


        //gitter.cells[row][column] = cell(tmp);
        gitter.setCell(row, column, tmp);

        if ((column == gitter.getElements() - 1) || generateCell(nextRow, nextCol)) {
            return true;
        }
    }

    // Wenn feste variable gehe immer weiter da ist nix zu tun
    if (gitter.cells[row][column].isStatic && generateCell(nextRow, nextCol)) {
        return true;
    }

    // Fehler. Keine Option vorhanden um die Zelle zu setzen
    gitter.cells[row][column] = cell(0);
    return false;
}